

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

operation_t * op_get(int symbol,int ver)

{
  operation_t *poVar1;
  uint uVar2;
  
  uVar2 = ver - 2;
  if ((uVar2 < 7) && ((0x67U >> (uVar2 & 0x1f) & 1) != 0)) {
    for (poVar1 = (operation_t *)(&DAT_00136a28 + *(int *)(&DAT_00136a28 + (ulong)uVar2 * 4));
        poVar1->symbol != 0; poVar1 = poVar1 + 1) {
      if (poVar1->symbol == symbol) {
        return poVar1;
      }
    }
  }
  return (operation_t *)0x0;
}

Assistant:

const operation_t*
op_get(
    int symbol,
    int ver
) {
    const operation_t* table = op_get_table(ver);
    if (table != NULL) {
        while(table->symbol) {
            if (table->symbol == symbol)
                return table;
            ++table;
        }
    }
    return NULL;
}